

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStreamComponent_Initialize
                  (PaAlsaStreamComponent *self,PaAlsaHostApiRepresentation *alsaApi,
                  PaStreamParameters *params,StreamDirection streamDir,int callbackMode)

{
  PaSampleFormat format;
  void *pvVar1;
  byte *pbVar2;
  PaDeviceInfo *pPVar3;
  int iVar4;
  uint uVar5;
  snd_pcm_format_t sVar6;
  PaSampleFormat PVar7;
  void **ppvVar8;
  PaError PVar9;
  bool bVar10;
  
  if (params->channelCount < 1) {
    __assert_fail("params->channelCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x754,
                  "PaError PaAlsaStreamComponent_Initialize(PaAlsaStreamComponent *, PaAlsaHostApiRepresentation *, const PaStreamParameters *, StreamDirection, int)"
                 );
  }
  format = params->sampleFormat;
  *(undefined8 *)&self->streamDir = 0;
  self->channelAreas = (snd_pcm_channel_area_t *)0x0;
  self->userBuffers = (void **)0x0;
  self->offset = 0;
  self->nativeFormat = SND_PCM_FORMAT_S8;
  self->nfds = 0;
  *(undefined8 *)&self->ready = 0;
  self->framesPerPeriod = 0;
  self->alsaBufferSize = 0;
  self->deviceIsPlug = 0;
  self->useReventFix = 0;
  self->pcm = (snd_pcm_t *)0x0;
  self->nonMmapBuffer = (void *)0x0;
  self->nonMmapBufferSize = 0;
  self->device = 0;
  self->userInterleaved = 0;
  self->hostInterleaved = 0;
  *(undefined8 *)&self->canMmap = 0;
  self->hostSampleFormat = 0;
  self->numUserChannels = 0;
  self->numHostChannels = 0;
  pvVar1 = params->hostApiSpecificStreamInfo;
  if (pvVar1 == (void *)0x0) {
    pPVar3 = (alsaApi->baseHostApiRep).deviceInfos[params->device];
    iVar4 = *(int *)((long)&pPVar3[1].name + (ulong)(streamDir != StreamDirection_In) * 4 + 4);
    if (iVar4 < params->channelCount) {
      iVar4 = params->channelCount;
    }
    self->numHostChannels = iVar4;
    iVar4 = *(int *)&pPVar3[1].name;
    self->deviceIsPlug = iVar4;
    if (iVar4 == 0) goto LAB_0010ca93;
  }
  else {
    self->numHostChannels = params->channelCount;
    pbVar2 = *(byte **)((long)pvVar1 + 0x18);
    iVar4 = *pbVar2 - 0x68;
    if ((iVar4 == 0) && (iVar4 = pbVar2[1] - 0x77, iVar4 == 0)) {
      iVar4 = 0x3a - (uint)pbVar2[2];
    }
    else {
      iVar4 = -iVar4;
    }
    if (iVar4 == 0) goto LAB_0010ca93;
    self->deviceIsPlug = 1;
  }
  if (alsaApi->alsaLibVersion < 0x10010) {
    self->useReventFix = 1;
  }
LAB_0010ca93:
  self->device = params->device;
  paUtilErr_ = AlsaOpen(&alsaApi->baseHostApiRep,params,streamDir,&self->pcm);
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'AlsaOpen( &alsaApi->baseHostApiRep, params, streamDir, &self->pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1902\n"
                     );
    PVar9 = paUtilErr_;
  }
  else {
    uVar5 = snd_pcm_poll_descriptors_count(self->pcm);
    self->nfds = uVar5;
    PVar7 = GetAvailableFormats(self->pcm);
    PVar7 = PaUtil_SelectClosestAvailableFormat(PVar7,format);
    paUtilErr_ = (PaError)PVar7;
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'hostSampleFormat = PaUtil_SelectClosestAvailableFormat( GetAvailableFormats( self->pcm ), userSampleFormat )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1905\n"
                       );
      PVar9 = paUtilErr_;
    }
    else {
      self->hostSampleFormat = PVar7;
      sVar6 = Pa2AlsaFormat(PVar7);
      self->nativeFormat = sVar6;
      bVar10 = -1 < (int)format;
      uVar5 = (uint)bVar10;
      self->userInterleaved = uVar5;
      self->hostInterleaved = uVar5;
      iVar4 = params->channelCount;
      self->numUserChannels = iVar4;
      self->streamDir = streamDir;
      self->canMmap = 0;
      self->nonMmapBuffer = (void *)0x0;
      self->nonMmapBufferSize = 0;
      PVar9 = 0;
      if (!bVar10 && callbackMode == 0) {
        ppvVar8 = (void **)PaUtil_AllocateMemory((long)iVar4 << 3);
        self->userBuffers = ppvVar8;
        if (ppvVar8 == (void **)0x0) {
          PaUtil_DebugPrint(
                           "Expression \'self->userBuffers = PaUtil_AllocateMemory( sizeof (void *) * self->numUserChannels )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1920\n"
                           );
          PVar9 = -0x2708;
        }
      }
    }
    if (PVar7 == 0xffffffffffffd8f6) {
      LogAllAvailableFormats(self->pcm);
    }
  }
  return PVar9;
}

Assistant:

static PaError PaAlsaStreamComponent_Initialize( PaAlsaStreamComponent *self, PaAlsaHostApiRepresentation *alsaApi,
        const PaStreamParameters *params, StreamDirection streamDir, int callbackMode )
{
    PaError result = paNoError;
    PaSampleFormat userSampleFormat = params->sampleFormat, hostSampleFormat = paNoError;
    assert( params->channelCount > 0 );

    /* Make sure things have an initial value */
    memset( self, 0, sizeof (PaAlsaStreamComponent) );

    if( NULL == params->hostApiSpecificStreamInfo )
    {
        const PaAlsaDeviceInfo *devInfo = GetDeviceInfo( &alsaApi->baseHostApiRep, params->device );
        self->numHostChannels = PA_MAX( params->channelCount, StreamDirection_In == streamDir ? devInfo->minInputChannels
                : devInfo->minOutputChannels );
        self->deviceIsPlug = devInfo->isPlug;
        PA_DEBUG(( "%s: Host Chans %c %i\n", __FUNCTION__, streamDir == StreamDirection_In ? 'C' : 'P', self->numHostChannels ));
    }
    else
    {
        /* We're blissfully unaware of the minimum channelCount */
        self->numHostChannels = params->channelCount;
        /* Check if device name does not start with hw: to determine if it is a 'plug' device */
        if( strncmp( "hw:", ((PaAlsaStreamInfo *)params->hostApiSpecificStreamInfo)->deviceString, 3 ) != 0  )
            self->deviceIsPlug = 1; /* An Alsa plug device, not a direct hw device */
    }
    if( self->deviceIsPlug && alsaApi->alsaLibVersion < ALSA_VERSION_INT( 1, 0, 16 ) )
        self->useReventFix = 1; /* Prior to Alsa1.0.16, plug devices may stutter without this fix */

    self->device = params->device;

    PA_ENSURE( AlsaOpen( &alsaApi->baseHostApiRep, params, streamDir, &self->pcm ) );
    self->nfds = alsa_snd_pcm_poll_descriptors_count( self->pcm );

    PA_ENSURE( hostSampleFormat = PaUtil_SelectClosestAvailableFormat( GetAvailableFormats( self->pcm ), userSampleFormat ) );

    self->hostSampleFormat = hostSampleFormat;
    self->nativeFormat = Pa2AlsaFormat( hostSampleFormat );
    self->hostInterleaved = self->userInterleaved = !( userSampleFormat & paNonInterleaved );
    self->numUserChannels = params->channelCount;
    self->streamDir = streamDir;
    self->canMmap = 0;
    self->nonMmapBuffer = NULL;
    self->nonMmapBufferSize = 0;

    if( !callbackMode && !self->userInterleaved )
    {
        /* Pre-allocate non-interleaved user provided buffers */
        PA_UNLESS( self->userBuffers = PaUtil_AllocateMemory( sizeof (void *) * self->numUserChannels ),
                paInsufficientMemory );
    }

error:

    /* Log all available formats. */
    if ( hostSampleFormat == paSampleFormatNotSupported )
    {
        LogAllAvailableFormats( self->pcm );
        PA_DEBUG(( "%s: Please provide the log output to PortAudio developers, your hardware does not have any sample format implemented yet.\n", __FUNCTION__ ));
    }

    return result;
}